

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O3

bool __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_>::normalize
          (miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *this)

{
  spectrum *lspec;
  uint *puVar1;
  pointer piVar2;
  uint uVar3;
  uint *puVar4;
  spectral_operation sVar5;
  uint *puVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  __hashtable *__h;
  bool bVar12;
  allocator_type local_51;
  ulong local_50;
  void *local_48 [2];
  long local_38;
  
  puVar7 = (this->order).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (this->order).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((puVar7 != puVar1) && (puVar6 = puVar7 + 1, puVar6 != puVar1)) {
    piVar2 = (this->spec)._s.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = *puVar7;
    do {
      uVar8 = piVar2[uVar10];
      uVar11 = -uVar8;
      if (0 < (int)uVar8) {
        uVar11 = uVar8;
      }
      uVar8 = piVar2[*puVar6];
      uVar3 = -uVar8;
      if (0 < (int)uVar8) {
        uVar3 = uVar8;
      }
      puVar4 = puVar6;
      uVar8 = *puVar6;
      if (uVar3 <= uVar11) {
        puVar4 = puVar7;
        uVar8 = uVar10;
      }
      uVar10 = uVar8;
      puVar7 = puVar4;
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
  }
  uVar10 = *puVar7;
  if (uVar10 != 0) {
    uVar8 = -uVar10 & uVar10;
    if (uVar8 != uVar10) {
      uVar10 = uVar10 ^ uVar8;
      do {
        uVar11 = -uVar10 & uVar10;
        sVar5 = spectrum::spectral_translation(&this->spec,uVar8,uVar11);
        local_50 = CONCAT26(local_50._6_2_,sVar5);
        insert(this,(spectral_operation *)&local_50);
        bVar12 = uVar11 != uVar10;
        uVar10 = uVar11 ^ uVar10;
      } while (bVar12);
    }
    if (this->hasDisjointTranslation == true) {
      sVar5 = spectrum::disjoint_translation(&this->spec,uVar8);
      local_50 = CONCAT26(local_50._6_2_,sVar5);
      insert(this,(spectral_operation *)&local_50);
    }
  }
  if (this->num_vars_exp != 0) {
    uVar9 = 1;
    do {
      local_50 = uVar9;
      std::vector<int,std::allocator<int>>::
      vector<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,std::allocator<int>> *)local_48,
                 (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (this->spec)._s.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (this->spec)._s.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_51);
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,kitty::detail::spectrum>,std::allocator<std::pair<unsigned_long_const,kitty::detail::spectrum>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<unsigned_long_const,kitty::detail::spectrum>>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,kitty::detail::spectrum>,std::allocator<std::pair<unsigned_long_const,kitty::detail::spectrum>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->specs,&local_50);
      if (local_48[0] != (void *)0x0) {
        operator_delete(local_48[0],local_38 - (long)local_48[0]);
      }
      uVar10 = (int)uVar9 * 2;
      uVar9 = (ulong)uVar10;
    } while (uVar10 <= this->num_vars_exp);
  }
  lspec = &this->spec;
  update_best(this,lspec);
  bVar12 = normalize_rec(this,lspec,1);
  std::vector<int,_std::allocator<int>_>::operator=(&lspec->_s,&(this->best_spec)._s);
  return bVar12;
}

Assistant:

bool normalize()
  {
    /* find maximum absolute element index in spectrum (by order) */
    auto j = *std::max_element( order.cbegin(), order.cend(), [this]( auto p1, auto p2 )
                                { return abs( spec[p1] ) < abs( spec[p2] ); } );

    /* if max element is not the first element */
    if ( j )
    {
      auto k = j - ( j & ( j - 1 ) ); /* LSB of j */
      j ^= k;                         /* delete bit in j */

      while ( j )
      {
        auto p = j - ( j & ( j - 1 ) ); /* next LSB of j */
        j ^= p;                         /* delete bit in j */
        insert( spec.spectral_translation( k, p ) );
      }
      if ( hasDisjointTranslation )
      {
        insert( spec.disjoint_translation( k ) );
      }
    }

    for ( auto v = 1u; v <= num_vars_exp; v <<= 1 )
    {
      specs.insert( { v, spec } );
    }

    update_best( spec );
    const auto result = normalize_rec( spec, 1 );
    spec = best_spec;
    return result;
  }